

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::DateTimePickerPrivate::DateTimePickerPrivate
          (DateTimePickerPrivate *this,DateTimePicker *parent,Type parserType)

{
  Scroller *this_00;
  QTime local_54;
  QDate local_50;
  QTime local_44;
  QDate local_40;
  QTime local_38 [4];
  QDate local_28;
  Type local_1c;
  DateTimePicker *pDStack_18;
  Type parserType_local;
  DateTimePicker *parent_local;
  DateTimePickerPrivate *this_local;
  
  local_1c = parserType;
  pDStack_18 = parent;
  parent_local = (DateTimePicker *)this;
  DateTimeParser::DateTimeParser(&this->super_DateTimeParser,parserType);
  (this->super_DateTimeParser)._vptr_DateTimeParser =
       (_func_int **)&PTR__DateTimePickerPrivate_00236120;
  this->q = pDStack_18;
  QDate::QDate(&local_28,0x6d8,9,0xe);
  QTime::QTime(local_38,0,0,0,0);
  QDateTime::QDateTime
            (&this->minimum,(QDate *)local_28.jd,(QTime *)(ulong)(uint)local_38[0].mds,LocalTime,0);
  QDate::QDate(&local_40,7999,0xc,0x1f);
  QTime::QTime(&local_44,0x17,0x3b,0x3b,999);
  QDateTime::QDateTime
            (&this->maximum,(QDate *)local_40.jd,(QTime *)(ulong)(uint)local_44.mds,LocalTime,0);
  QDate::QDate(&local_50,2000,1,1);
  QTime::QTime(&local_54,0,0,0,0);
  QDateTime::QDateTime
            (&this->value,(QDate *)local_50.jd,(QTime *)(ulong)(uint)local_54.mds,LocalTime,0);
  this->spec = LocalTime;
  this->itemHeight = 0;
  this->itemTopMargin = 0;
  this->itemsMaxCount = 5;
  this->itemSideMargin = 5;
  this->widgetHeight = 0;
  this->currentItemY = 0;
  QPoint::QPoint(&this->mousePos);
  this->leftMouseButtonPressed = false;
  this->movableSection = -1;
  this->daysSection = -1;
  this->monthSection = -1;
  this->yearSection = -1;
  this_00 = (Scroller *)operator_new(0x18);
  Scroller::Scroller(this_00,(QObject *)this->q,(QObject *)this->q);
  this->scroller = this_00;
  this->scrolling = false;
  initDaysMonthYearSectionIndex(this);
  fillValues(this,true);
  return;
}

Assistant:

DateTimePickerPrivate( DateTimePicker * parent,
		QMetaType::Type parserType )
		:	DateTimeParser( parserType )
		,	q( parent )
		,	minimum( QDateTime( DATETIMEPICKER_COMPAT_DATE_MIN,
				DATETIMEPICKER_TIME_MIN ) )
		,	maximum( DATETIMEPICKER_DATETIME_MAX )
		,	value( QDateTime( DATETIMEPICKER_DATE_INITIAL,
				DATETIMEPICKER_TIME_MIN ) )
		,	spec( Qt::LocalTime )
		,	itemHeight( 0 )
		,	itemTopMargin( 0 )
		,	itemsMaxCount( 5 )
		,	itemSideMargin( 5 )
		,	widgetHeight( 0 )
		,	currentItemY( 0 )
		,	leftMouseButtonPressed( false )
		,	movableSection( -1 )
		,	daysSection( -1 )
		,	monthSection( -1 )
		,	yearSection( -1 )
		,	scroller( new Scroller( q, q ) )
		,	scrolling( false )
	{
		initDaysMonthYearSectionIndex();
		fillValues();
	}